

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.h
# Opt level: O2

void __thiscall cnn::Dict::Dict(Dict *this)

{
  this->frozen = false;
  this->map_unk = false;
  this->unk_id = -1;
  (this->words_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->words_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->words_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->d_)._M_h._M_buckets = &(this->d_)._M_h._M_single_bucket;
  (this->d_)._M_h._M_bucket_count = 1;
  (this->d_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->d_)._M_h._M_element_count = 0;
  (this->d_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->d_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->d_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Dict() : frozen(false), map_unk(false), unk_id(-1) {
  }